

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O1

Context * __thiscall
Hpipe::Context::with_string(Context *__return_storage_ptr__,Context *this,string *str)

{
  PathsToStrings *this_00;
  const_iterator cVar1;
  ostream *poVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  Vec<unsigned_int> local_40;
  
  std::vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>::vector
            ((vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_> *)
             __return_storage_ptr__,
             (vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_> *)this);
  __return_storage_ptr__->mark = this->mark;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&(__return_storage_ptr__->paths_to_mark).
              super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
             &(this->paths_to_mark).super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
  this_00 = &__return_storage_ptr__->paths_to_strings;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
  ::_Rb_tree(&this_00->_M_t,&(this->paths_to_strings)._M_t);
  __return_storage_ptr__->flags = this->flags;
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
          ::find(&this_00->_M_t,str);
  if ((_Rb_tree_header *)cVar1._M_node !=
      &(__return_storage_ptr__->paths_to_strings)._M_t._M_impl.super__Rb_tree_header) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error: ",7);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(str->_M_dataplus)._M_p,str->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," is already in the context",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  range_vec<unsigned_int>
            (&local_40,
             (uint)((ulong)((long)(this->pos).
                                  super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                  .
                                  super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->pos).
                                 super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                 .
                                 super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3));
  pvVar3 = &std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
            ::operator[](this_00,str)->super_vector<unsigned_int,_std::allocator<unsigned_int>_>;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pvVar3,&local_40);
  if (local_40.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Context Context::with_string( const std::string &str ) const {
    Context res( *this );
    if ( res.paths_to_strings.count( str ) )
        std::cerr << "Error: " << str << " is already in the context" << std::endl;
    res.paths_to_strings[ str ] = range_vec( unsigned( pos.size() ) );
    return res;
}